

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_strncasecmp(char *s1,char *s2,size_t n)

{
  char cVar1;
  int iVar2;
  char c2;
  size_t sStack_28;
  char c1;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  sStack_28 = n;
  n_local = (size_t)s2;
  s2_local = s1;
  while( true ) {
    if (sStack_28 == 0) {
      return 0;
    }
    iVar2 = toupper((int)*s2_local);
    cVar1 = (char)iVar2;
    iVar2 = toupper((int)*(char *)n_local);
    if (cVar1 < (char)iVar2) {
      return -1;
    }
    if ((char)iVar2 < cVar1) {
      return 1;
    }
    if (cVar1 == '\0') break;
    s2_local = s2_local + 1;
    n_local = n_local + 1;
    sStack_28 = sStack_28 - 1;
  }
  return 0;
}

Assistant:

int fits_strncasecmp(const char *s1, const char *s2, size_t n)
{
   char c1, c2;

   for (; n-- ;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
   return(0);
}